

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O0

int __thiscall KParser::_decassign(KParser *this,int begin,BlockInfo *bi)

{
  int iVar1;
  reference pvVar2;
  mapped_type *pmVar3;
  undefined8 uVar4;
  allocator local_349;
  string local_348 [32];
  string local_328 [39];
  allocator local_301;
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [32];
  char local_2b8 [8];
  char buf_1 [256];
  allocator local_1a9;
  string local_1a8 [32];
  char local_188 [8];
  char buf [256];
  BlockInfo local_78;
  int local_38;
  int local_34;
  int exprIndex;
  int idIndex;
  int t;
  int i;
  BlockInfo *bi_local;
  KParser *pKStack_18;
  int begin_local;
  KParser *this_local;
  
  local_34 = begin;
  idIndex = begin;
  _t = bi;
  bi_local._4_4_ = begin;
  pKStack_18 = this;
  pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[](&this->m_tokens,(long)begin);
  if (pvVar2->tokenType == id) {
    idIndex = idIndex + 1;
    pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[](&this->m_tokens,(long)idIndex);
    if (pvVar2->tokenType == decassign) {
      iVar1 = idIndex + 1;
      local_38 = iVar1;
      idIndex = iVar1;
      BlockInfo::BlockInfo(&local_78,bi);
      exprIndex = _expr(this,iVar1,&local_78);
      BlockInfo::~BlockInfo(&local_78);
      if (exprIndex < 0) {
        pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           (&this->m_tokens,(long)idIndex);
        sprintf(local_188,anon_var_dwarf_f2be,(ulong)(uint)pvVar2->line);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a8,local_188,&local_1a9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_errorMsgs,(value_type *)local_1a8);
        std::__cxx11::string::~string(local_1a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
        this_local._4_4_ = -1;
      }
      else {
        idIndex = exprIndex;
        pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[]
                           (&this->m_tokens,(long)exprIndex);
        if (pvVar2->tokenType == semicolon) {
          idIndex = idIndex + 1;
          this->m_locals = this->m_locals + 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_300,"pop",&local_301);
          pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[]
                             (&this->m_tokens,(long)local_34);
          std::__cxx11::string::string(local_328,(string *)pvVar2);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_348,"",&local_349);
          addCode(this,(string *)local_300,(string *)local_328,(string *)local_348);
          std::__cxx11::string::~string(local_348);
          std::allocator<char>::~allocator((allocator<char> *)&local_349);
          std::__cxx11::string::~string(local_328);
          std::__cxx11::string::~string(local_300);
          std::allocator<char>::~allocator((allocator<char> *)&local_301);
          iVar1 = this->m_increaseLocals;
          this->m_increaseLocals = iVar1 + 1;
          pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[]
                             (&this->m_tokens,(long)local_34);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](&this->m_varToLocal,&pvVar2->str);
          *pmVar3 = iVar1;
          std::vector<Token,_std::allocator<Token>_>::operator[](&this->m_tokens,(long)local_34);
          uVar4 = std::__cxx11::string::c_str();
          printf("%s => %d\n",uVar4,(ulong)(uint)this->m_increaseLocals);
          this_local._4_4_ = idIndex;
        }
        else {
          pvVar2 = std::vector<Token,_std::allocator<Token>_>::operator[]
                             (&this->m_tokens,(long)idIndex);
          sprintf(local_2b8,anon_var_dwarf_f2c9,(ulong)(uint)pvVar2->line);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2d8,local_2b8,&local_2d9);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->m_errorMsgs,(value_type *)local_2d8);
          std::__cxx11::string::~string(local_2d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
          this_local._4_4_ = -1;
        }
      }
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int KParser::_decassign(int begin,  BlockInfo bi) {
    int i = begin;
    int t;
    int idIndex = i;
    if (m_tokens[i].tokenType != TokenType::id) {
        return -1;
    } 
    i++; 
    if (m_tokens[i].tokenType != TokenType::decassign) {
        return -1;
    } 
    i++; 

    int exprIndex = i;
    t = _expr(i, bi);
    if (t < 0) {
        char buf[256];
        sprintf(buf, "line[%d]: decassign 표현식의 오류\n", m_tokens[i].line); 
        m_errorMsgs.push_back(buf);
        return -1;
    } 
    i = t;

    if (m_tokens[i].tokenType != TokenType::semicolon) {
        char buf[256];
        sprintf(buf, "line[%d]: _decassign ; 가 빠졌습니다.\n", m_tokens[i].line); 
        m_errorMsgs.push_back(buf);
        return -1;
    }
    i++;
    m_locals++;
    addCode("pop", m_tokens[idIndex].str, "");
    m_varToLocal[m_tokens[idIndex].str] = m_increaseLocals++;
    printf("%s => %d\n",  m_tokens[idIndex].str.c_str(), m_increaseLocals);
    return i;
}